

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to4_int8.h
# Opt level: O2

void ncnn::im2col_sgemm_pack1to4_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int *piVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  undefined1 *puVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  undefined1 *puVar25;
  ulong uVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  undefined1 (*pauVar30) [16];
  ulong uVar31;
  int iVar32;
  ulong uVar33;
  size_t _elemsize;
  long lVar34;
  undefined1 (*pauVar35) [16];
  ulong *puVar36;
  long lVar37;
  undefined1 (*pauVar38) [16];
  long lVar39;
  long lVar40;
  long lVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar51 [16];
  undefined1 auVar50 [64];
  undefined1 auVar53 [16];
  undefined1 auVar52 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 local_a8 [64];
  size_t local_68;
  ulong local_58;
  ulong local_50;
  Mat *local_48;
  ulong local_40;
  Mat *local_38;
  
  uVar1 = bottom_im2col->w;
  uVar27 = bottom_im2col->h;
  local_58 = (ulong)uVar27;
  uVar2 = bottom_im2col->c;
  uVar33 = (ulong)(int)uVar2;
  local_40 = (ulong)(uint)top_blob->c;
  local_68 = 0;
  local_a8._0_8_ = (void *)0x0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_8_ = 0;
  local_a8._24_4_ = 0;
  local_a8._32_8_ = (Allocator *)0x0;
  local_a8._40_4_ = 0;
  local_a8._44_4_ = 0;
  local_a8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  uVar15 = uVar1;
  if ((long)uVar33 < 4) {
    _elemsize = 1;
    iVar17 = 1;
    uVar23 = uVar2;
    if ((int)uVar1 < 4) {
      if (1 < (int)uVar1) {
        uVar27 = uVar27 * 2;
        uVar15 = (uVar1 & 1) + 1;
      }
    }
    else {
      uVar27 = uVar27 * 4;
      uVar15 = (uVar1 & 1) + (uVar1 >> 2) + (uint)((uVar1 >> 1 & 1) != 0);
    }
  }
  else {
    _elemsize = 4;
    if ((int)uVar1 < 4) {
      if ((int)uVar1 < 2) {
        uVar23 = (uVar2 & 3) + ((uint)(uVar33 >> 2) & 0x3fffffff);
      }
      else {
        uVar27 = uVar27 * 2;
        uVar23 = (uVar2 & 3) + ((uint)(uVar33 >> 2) & 0x3fffffff);
        uVar15 = (uVar1 & 1) + 1;
      }
    }
    else {
      uVar27 = uVar27 * 4;
      uVar23 = (uVar2 & 3) + ((uint)(uVar33 >> 2) & 0x3fffffff);
      uVar15 = (uVar1 & 1) + (uVar1 >> 2) + (uint)((uVar1 >> 1 & 1) != 0);
    }
    iVar17 = 4;
  }
  local_48 = kernel;
  local_38 = top_blob;
  Mat::create((Mat *)local_a8,uVar27,uVar23,uVar15,_elemsize,iVar17,opt->workspace_allocator);
  uVar31 = (ulong)(int)uVar1;
  iVar16 = (int)local_58;
  iVar17 = 0;
  if (0 < iVar16) {
    iVar17 = iVar16;
  }
  lVar40 = 0;
  uVar22 = (ulong)(uint)((int)uVar1 >> 2);
  if ((int)uVar1 >> 2 < 1) {
    uVar22 = 0;
  }
  lVar29 = 1;
  for (uVar20 = 0; uVar20 != uVar22; uVar20 = uVar20 + 1) {
    puVar25 = (undefined1 *)(local_68 * uVar20 * local_a8._16_8_ + local_a8._0_8_);
    lVar34 = 2;
    lVar24 = 1;
    lVar28 = 3;
    for (uVar26 = 0; (long)(uVar26 | 3) < (long)uVar33; uVar26 = uVar26 + 4) {
      lVar21 = bottom_im2col->cstep * bottom_im2col->elemsize;
      lVar37 = lVar21 * uVar26;
      lVar41 = (long)bottom_im2col->data + lVar40;
      lVar18 = lVar21 * lVar28;
      lVar39 = lVar21 * lVar24;
      lVar21 = lVar21 * lVar34;
      iVar32 = iVar17;
      while (bVar42 = iVar32 != 0, iVar32 = iVar32 + -1, bVar42) {
        *puVar25 = *(undefined1 *)(lVar41 + lVar37);
        puVar25[1] = *(undefined1 *)(lVar41 + lVar39);
        puVar25[2] = *(undefined1 *)(lVar41 + lVar21);
        puVar25[3] = *(undefined1 *)(lVar41 + lVar18);
        puVar25[4] = *(undefined1 *)(lVar41 + 1 + lVar37);
        puVar25[5] = *(undefined1 *)(lVar41 + 1 + lVar39);
        puVar25[6] = *(undefined1 *)(lVar41 + 1 + lVar21);
        puVar25[7] = *(undefined1 *)(lVar41 + 1 + lVar18);
        puVar25[8] = *(undefined1 *)(lVar41 + 2 + lVar37);
        puVar25[9] = *(undefined1 *)(lVar41 + 2 + lVar39);
        puVar25[10] = *(undefined1 *)(lVar41 + 2 + lVar21);
        puVar25[0xb] = *(undefined1 *)(lVar41 + 2 + lVar18);
        puVar25[0xc] = *(undefined1 *)(lVar41 + 3 + lVar37);
        puVar25[0xd] = *(undefined1 *)(lVar41 + 3 + lVar39);
        puVar25[0xe] = *(undefined1 *)(lVar41 + 3 + lVar21);
        puVar25[0xf] = *(undefined1 *)(lVar41 + 3 + lVar18);
        puVar25 = puVar25 + 0x10;
        lVar41 = lVar41 + uVar31;
      }
      lVar28 = lVar28 + 4;
      lVar24 = lVar24 + 4;
      lVar34 = lVar34 + 4;
    }
    for (; (long)uVar26 < (long)uVar33; uVar26 = uVar26 + 1) {
      puVar19 = (undefined1 *)
                ((long)bottom_im2col->data +
                bottom_im2col->cstep * bottom_im2col->elemsize * uVar26 + lVar29);
      iVar32 = iVar17;
      while (bVar42 = iVar32 != 0, iVar32 = iVar32 + -1, bVar42) {
        *puVar25 = puVar19[-1];
        puVar25[1] = *puVar19;
        puVar25[2] = puVar19[1];
        puVar25[3] = puVar19[2];
        puVar25 = puVar25 + 4;
        puVar19 = puVar19 + uVar31;
      }
    }
    lVar40 = lVar40 + 4;
    lVar29 = lVar29 + 4;
  }
  local_50 = uVar31 & 0xfffffffffffffffc;
  uVar27 = uVar1 >> 1 & 1;
  lVar40 = local_50 + 1;
  uVar22 = local_50;
  for (uVar20 = 0; uVar20 != uVar27; uVar20 = uVar20 + 1) {
    iVar32 = (int)local_50 + (int)uVar20 * 2;
    puVar25 = (undefined1 *)
              ((long)((iVar32 % 4 >> 1) + iVar32 / 4) * local_68 * local_a8._16_8_ + local_a8._0_8_)
    ;
    lVar29 = 1;
    lVar34 = 2;
    lVar24 = 3;
    for (uVar26 = 0; (long)(uVar26 | 3) < (long)uVar33; uVar26 = uVar26 + 4) {
      lVar18 = bottom_im2col->cstep * bottom_im2col->elemsize;
      lVar28 = (long)bottom_im2col->data + uVar22;
      iVar32 = iVar17;
      while (bVar42 = iVar32 != 0, iVar32 = iVar32 + -1, bVar42) {
        *puVar25 = *(undefined1 *)(lVar28 + lVar18 * uVar26);
        puVar25[1] = *(undefined1 *)(lVar28 + lVar18 * lVar29);
        puVar25[2] = *(undefined1 *)(lVar28 + lVar18 * lVar34);
        puVar25[3] = *(undefined1 *)(lVar28 + lVar18 * lVar24);
        puVar25[4] = *(undefined1 *)(lVar28 + 1 + lVar18 * uVar26);
        puVar25[5] = *(undefined1 *)(lVar28 + 1 + lVar18 * lVar29);
        puVar25[6] = *(undefined1 *)(lVar28 + 1 + lVar18 * lVar34);
        puVar25[7] = *(undefined1 *)(lVar28 + 1 + lVar18 * lVar24);
        puVar25 = puVar25 + 8;
        lVar28 = lVar28 + uVar31;
      }
      lVar24 = lVar24 + 4;
      lVar34 = lVar34 + 4;
      lVar29 = lVar29 + 4;
    }
    for (; (long)uVar26 < (long)uVar33; uVar26 = uVar26 + 1) {
      puVar19 = (undefined1 *)
                ((long)bottom_im2col->data +
                bottom_im2col->cstep * bottom_im2col->elemsize * uVar26 + lVar40);
      iVar32 = iVar17;
      while (bVar42 = iVar32 != 0, iVar32 = iVar32 + -1, bVar42) {
        *puVar25 = puVar19[-1];
        puVar25[1] = *puVar19;
        puVar25 = puVar25 + 2;
        puVar19 = puVar19 + uVar31;
      }
    }
    uVar22 = uVar22 + 2;
    lVar40 = lVar40 + 2;
  }
  for (uVar22 = (ulong)(int)((int)local_50 + uVar27 * 2); (long)uVar22 < (long)uVar31;
      uVar22 = uVar22 + 1) {
    uVar27 = (int)uVar22 >> 0x1f;
    uVar20 = (ulong)uVar27 << 0x20 | uVar22 & 0xffffffff;
    puVar25 = (undefined1 *)
              ((long)((int)((long)((ulong)uVar27 << 0x20 | uVar22 & 0xffffffff) % 2) +
                      (int)((long)uVar20 / 4) + (int)(char)((char)((long)uVar20 % 4) / '\x02')) *
               local_68 * local_a8._16_8_ + local_a8._0_8_);
    lVar40 = 1;
    lVar29 = 2;
    lVar34 = 3;
    for (uVar20 = 0; (long)(uVar20 | 3) < (long)uVar33; uVar20 = uVar20 + 4) {
      lVar28 = bottom_im2col->cstep * bottom_im2col->elemsize;
      lVar24 = (long)bottom_im2col->data + uVar22;
      iVar32 = iVar17;
      while (bVar42 = iVar32 != 0, iVar32 = iVar32 + -1, bVar42) {
        *puVar25 = *(undefined1 *)(lVar24 + lVar28 * uVar20);
        puVar25[1] = *(undefined1 *)(lVar24 + lVar28 * lVar40);
        puVar25[2] = *(undefined1 *)(lVar24 + lVar28 * lVar29);
        puVar25[3] = *(undefined1 *)(lVar24 + lVar28 * lVar34);
        puVar25 = puVar25 + 4;
        lVar24 = lVar24 + uVar31;
      }
      lVar34 = lVar34 + 4;
      lVar29 = lVar29 + 4;
      lVar40 = lVar40 + 4;
    }
    for (; (long)uVar20 < (long)uVar33; uVar20 = uVar20 + 1) {
      puVar19 = (undefined1 *)
                ((long)bottom_im2col->data +
                uVar22 + bottom_im2col->cstep * uVar20 * bottom_im2col->elemsize);
      iVar32 = iVar17;
      while (bVar42 = iVar32 != 0, iVar32 = iVar32 + -1, bVar42) {
        *puVar25 = *puVar19;
        puVar25 = puVar25 + 1;
        puVar19 = puVar19 + uVar31;
      }
    }
  }
  iVar17 = ((int)uVar2 / 4) * iVar16;
  uVar27 = ((int)uVar2 % 4) * iVar16;
  uVar22 = 0;
  uVar33 = (ulong)uVar27;
  if ((int)uVar27 < 1) {
    uVar33 = uVar22;
  }
  uVar20 = local_40 & 0xffffffff;
  if ((int)local_40 < 1) {
    uVar20 = uVar22;
  }
  for (; uVar22 != uVar20; uVar22 = uVar22 + 1) {
    pauVar30 = (undefined1 (*) [16])
               (local_38->cstep * uVar22 * local_38->elemsize + (long)local_38->data);
    for (uVar26 = 0; iVar16 = (int)uVar33, (long)(uVar26 | 3) < (long)uVar31; uVar26 = uVar26 + 4) {
      pauVar35 = (undefined1 (*) [16])((uVar26 >> 2) * local_68 * local_a8._16_8_ + local_a8._0_8_);
      pauVar38 = (undefined1 (*) [16])
                 (local_48->cstep * uVar22 * local_48->elemsize + (long)local_48->data);
      if (iVar17 < 1) {
        auVar52 = ZEXT1664((undefined1  [16])0x0);
        auVar50 = ZEXT1664((undefined1  [16])0x0);
      }
      else {
        auVar50 = ZEXT1664((undefined1  [16])0x0);
        auVar52 = ZEXT1664((undefined1  [16])0x0);
        auVar54 = ZEXT1664((undefined1  [16])0x0);
        auVar57 = ZEXT1664((undefined1  [16])0x0);
        auVar62 = ZEXT1664((undefined1  [16])0x0);
        auVar64 = ZEXT1664((undefined1  [16])0x0);
        auVar60 = ZEXT1664((undefined1  [16])0x0);
        auVar66 = ZEXT1664((undefined1  [16])0x0);
        iVar32 = iVar17;
        while( true ) {
          bVar42 = iVar32 == 0;
          iVar32 = iVar32 + -1;
          auVar63 = auVar64._0_32_;
          auVar65 = auVar66._0_32_;
          auVar46 = auVar57._0_32_;
          auVar61 = auVar62._0_32_;
          auVar47 = auVar54._0_32_;
          auVar59 = auVar60._0_32_;
          auVar49 = auVar50._0_32_;
          auVar48 = auVar52._0_32_;
          if (bVar42) break;
          auVar6 = vpmovsxbw_avx2(*pauVar35);
          auVar10 = vpermq_avx2(auVar6,0x50);
          auVar11 = vpermq_avx2(auVar6,0xfa);
          auVar7 = vpmovsxbw_avx2(*pauVar38);
          auVar12 = vpermq_avx2(auVar6,5);
          auVar13 = vpermq_avx2(auVar6,0xaf);
          auVar8 = vpmullw_avx2(auVar10,auVar7);
          auVar6 = vpmulhw_avx2(auVar10,auVar7);
          auVar9 = vpmullw_avx2(auVar12,auVar7);
          auVar10 = vpmulhw_avx2(auVar12,auVar7);
          auVar44 = vpmullw_avx512vl(auVar11,auVar7);
          auVar11 = vpmulhw_avx2(auVar11,auVar7);
          auVar45 = vpmullw_avx512vl(auVar13,auVar7);
          auVar7 = vpmulhw_avx2(auVar13,auVar7);
          auVar12 = vpunpcklwd_avx2(auVar8,auVar6);
          auVar65 = vpaddd_avx2(auVar65,auVar12);
          auVar66 = ZEXT3264(auVar65);
          auVar65 = vpunpcklwd_avx2(auVar9,auVar10);
          auVar63 = vpaddd_avx2(auVar65,auVar63);
          auVar64 = ZEXT3264(auVar63);
          auVar63 = vpunpckhwd_avx2(auVar8,auVar6);
          auVar61 = vpaddd_avx2(auVar63,auVar61);
          auVar62 = ZEXT3264(auVar61);
          auVar61 = vpunpckhwd_avx2(auVar9,auVar10);
          auVar46 = vpaddd_avx2(auVar61,auVar46);
          auVar57 = ZEXT3264(auVar46);
          auVar46 = vpunpcklwd_avx512vl(auVar44,auVar11);
          auVar46 = vpaddd_avx2(auVar46,auVar59);
          auVar60 = ZEXT3264(auVar46);
          auVar46 = vpunpcklwd_avx512vl(auVar45,auVar7);
          auVar47 = vpaddd_avx2(auVar46,auVar47);
          auVar54 = ZEXT3264(auVar47);
          auVar47 = vpunpckhwd_avx512vl(auVar44,auVar11);
          auVar48 = vpaddd_avx2(auVar47,auVar48);
          auVar52 = ZEXT3264(auVar48);
          auVar48 = vpunpckhwd_avx512vl(auVar45,auVar7);
          auVar49 = vpaddd_avx2(auVar48,auVar49);
          auVar50 = ZEXT3264(auVar49);
          pauVar35 = pauVar35 + 1;
          pauVar38 = pauVar38 + 1;
        }
        auVar6 = vpunpckldq_avx2(auVar65,auVar63);
        auVar7 = vpunpckldq_avx2(auVar61,auVar46);
        auVar63 = vpunpckhdq_avx2(auVar65,auVar63);
        auVar46 = vpunpckhdq_avx2(auVar61,auVar46);
        auVar61 = vpunpckldq_avx2(auVar59,auVar47);
        auVar65 = vpunpckldq_avx2(auVar48,auVar49);
        auVar47 = vpunpckhdq_avx2(auVar59,auVar47);
        auVar59 = vpunpckhdq_avx2(auVar48,auVar49);
        auVar49 = vpunpckhdq_avx2(auVar6,auVar7);
        auVar48 = vpermq_avx2(auVar49,0x9c);
        auVar49 = vpunpckldq_avx2(auVar6,auVar7);
        auVar49 = vpermq_avx2(auVar49,0x9c);
        auVar49 = vpaddd_avx2(auVar49,auVar48);
        auVar48 = vpunpckhdq_avx2(auVar63,auVar46);
        auVar6 = vpermq_avx2(auVar48,0x9c);
        auVar48 = vpunpckldq_avx2(auVar63,auVar46);
        auVar48 = vpermq_avx2(auVar48,0x9c);
        auVar48 = vpaddd_avx2(auVar6,auVar48);
        auVar49 = vpaddd_avx2(auVar49,auVar48);
        auVar50 = ZEXT3264(auVar49);
        auVar49 = vpunpckhdq_avx2(auVar61,auVar65);
        auVar48 = vpermq_avx2(auVar49,0x9c);
        auVar49 = vpunpckldq_avx2(auVar61,auVar65);
        auVar49 = vpermq_avx2(auVar49,0x9c);
        auVar49 = vpaddd_avx2(auVar49,auVar48);
        auVar48 = vpunpckhdq_avx2(auVar47,auVar59);
        auVar46 = vpermq_avx2(auVar48,0x9c);
        auVar48 = vpunpckldq_avx2(auVar47,auVar59);
        auVar48 = vpermq_avx2(auVar48,0x9c);
        auVar48 = vpaddd_avx2(auVar46,auVar48);
        auVar49 = vpaddd_avx2(auVar49,auVar48);
        auVar52 = ZEXT3264(auVar49);
      }
      auVar51 = auVar50._16_16_;
      auVar53 = auVar52._16_16_;
      lVar40 = 0;
      while( true ) {
        if (iVar16 == (int)lVar40) break;
        auVar43 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar35 + lVar40 * 4)));
        auVar43 = vpshuflw_avx(auVar43,0x50);
        auVar56 = vpshufd_avx(auVar43,0x50);
        auVar43 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar35 + lVar40 * 4 + 2)));
        auVar43 = vpshuflw_avx(auVar43,0x50);
        auVar55 = vpshufd_avx(auVar43,0x50);
        auVar43 = vpmovsxbw_avx(ZEXT416(*(uint *)(*pauVar38 + lVar40 * 4)));
        auVar43._8_8_ = auVar43._0_8_;
        auVar3 = vpmullw_avx(auVar43,auVar56);
        auVar56 = vpmulhw_avx(auVar56,auVar43);
        auVar4 = vpmullw_avx(auVar43,auVar55);
        auVar55 = vpmulhw_avx(auVar55,auVar43);
        auVar43 = vpunpcklwd_avx(auVar3,auVar56);
        auVar43 = vpaddd_avx(auVar43,auVar50._0_16_);
        auVar50 = ZEXT1664(auVar43);
        auVar43 = vpunpckhwd_avx(auVar3,auVar56);
        auVar51 = vpaddd_avx(auVar43,auVar51);
        auVar43 = vpunpcklwd_avx(auVar4,auVar55);
        auVar43 = vpaddd_avx(auVar43,auVar52._0_16_);
        auVar52 = ZEXT1664(auVar43);
        auVar43 = vpunpckhwd_avx(auVar4,auVar55);
        auVar53 = vpaddd_avx(auVar43,auVar53);
        lVar40 = lVar40 + 1;
      }
      *pauVar30 = auVar50._0_16_;
      pauVar30[1] = auVar51;
      pauVar30[2] = auVar52._0_16_;
      pauVar30[3] = auVar53;
      pauVar30 = pauVar30 + 4;
    }
    while (uVar27 = (uint)uVar26, (int)(uVar27 | 1) < (int)uVar1) {
      pauVar35 = (undefined1 (*) [16])
                 ((((uint)(uVar26 >> 2) & 0x3fffffff) + (uint)((uVar27 >> 1 & 1) != 0)) * local_68 *
                  local_a8._16_8_ + local_a8._0_8_);
      pauVar38 = (undefined1 (*) [16])
                 (local_48->cstep * uVar22 * local_48->elemsize + (long)local_48->data);
      auVar50 = ZEXT1664((undefined1  [16])0x0);
      if (0 < iVar17) {
        auVar52 = ZEXT1664((undefined1  [16])0x0);
        auVar54 = ZEXT1664((undefined1  [16])0x0);
        auVar57 = ZEXT1664((undefined1  [16])0x0);
        iVar32 = iVar17;
        while( true ) {
          bVar42 = iVar32 == 0;
          iVar32 = iVar32 + -1;
          auVar49 = auVar50._0_32_;
          auVar48 = auVar52._0_32_;
          auVar47 = auVar54._0_32_;
          auVar46 = auVar57._0_32_;
          if (bVar42) break;
          auVar59 = vpmovsxbw_avx2(*pauVar35);
          auVar61 = vpmovsxbw_avx2(*pauVar38);
          auVar65 = vpermq_avx2(auVar59,0x50);
          auVar6 = vpermq_avx2(auVar59,5);
          auVar63 = vpmullw_avx2(auVar65,auVar61);
          auVar59 = vpmulhw_avx2(auVar65,auVar61);
          auVar65 = vpmullw_avx2(auVar6,auVar61);
          auVar61 = vpmulhw_avx2(auVar6,auVar61);
          auVar6 = vpunpcklwd_avx2(auVar63,auVar59);
          auVar49 = vpaddd_avx2(auVar49,auVar6);
          auVar50 = ZEXT3264(auVar49);
          auVar49 = vpunpcklwd_avx2(auVar65,auVar61);
          auVar49 = vpaddd_avx2(auVar48,auVar49);
          auVar52 = ZEXT3264(auVar49);
          auVar49 = vpunpckhwd_avx2(auVar63,auVar59);
          auVar49 = vpaddd_avx2(auVar47,auVar49);
          auVar54 = ZEXT3264(auVar49);
          auVar49 = vpunpckhwd_avx2(auVar65,auVar61);
          auVar49 = vpaddd_avx2(auVar46,auVar49);
          auVar57 = ZEXT3264(auVar49);
          pauVar35 = (undefined1 (*) [16])(*pauVar35 + 8);
          pauVar38 = pauVar38 + 1;
        }
        auVar59 = vpunpckldq_avx2(auVar49,auVar48);
        auVar61 = vpunpckldq_avx2(auVar47,auVar46);
        auVar48 = vpunpckhdq_avx2(auVar49,auVar48);
        auVar47 = vpunpckhdq_avx2(auVar47,auVar46);
        auVar49 = vpunpckhdq_avx2(auVar59,auVar61);
        auVar46 = vpermq_avx2(auVar49,0x9c);
        auVar49 = vpunpckldq_avx2(auVar59,auVar61);
        auVar49 = vpermq_avx2(auVar49,0x9c);
        auVar49 = vpaddd_avx2(auVar49,auVar46);
        auVar46 = vpunpckhdq_avx2(auVar48,auVar47);
        auVar46 = vpermq_avx2(auVar46,0x9c);
        auVar48 = vpunpckldq_avx2(auVar48,auVar47);
        auVar48 = vpermq_avx2(auVar48,0x9c);
        auVar48 = vpaddd_avx2(auVar46,auVar48);
        auVar49 = vpaddd_avx2(auVar49,auVar48);
        auVar50 = ZEXT3264(auVar49);
      }
      auVar51 = auVar50._16_16_;
      for (lVar40 = 0; iVar16 != (int)lVar40; lVar40 = lVar40 + 1) {
        auVar53 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar35 + lVar40 * 2)));
        auVar53 = vpshuflw_avx(auVar53,0x50);
        auVar43 = vpshufd_avx(auVar53,0x50);
        auVar53._8_8_ = 0;
        auVar53._0_8_ = *(ulong *)(*pauVar38 + lVar40 * 4);
        auVar53 = vpmovsxbw_avx(auVar53);
        auVar55._0_8_ = auVar53._0_8_;
        auVar55._8_8_ = auVar55._0_8_;
        auVar56 = vpmullw_avx(auVar43,auVar55);
        auVar43 = vpmulhw_avx(auVar43,auVar55);
        auVar53 = vpunpcklwd_avx(auVar56,auVar43);
        auVar53 = vpaddd_avx(auVar53,auVar50._0_16_);
        auVar50 = ZEXT1664(auVar53);
        auVar53 = vpunpckhwd_avx(auVar56,auVar43);
        auVar51 = vpaddd_avx(auVar53,auVar51);
      }
      *pauVar30 = auVar50._0_16_;
      pauVar30[1] = auVar51;
      pauVar30 = pauVar30 + 2;
      uVar26 = (ulong)(uVar27 + 2);
    }
    while (uVar27 = (uint)uVar26, (int)uVar27 < (int)uVar1) {
      puVar36 = (ulong *)(((uVar27 & 1) + ((uint)(uVar26 >> 2) & 0x3fffffff) +
                          (uint)((uVar27 >> 1 & 1) != 0)) * local_68 * local_a8._16_8_ +
                         local_a8._0_8_);
      pauVar35 = (undefined1 (*) [16])
                 (local_48->cstep * uVar22 * local_48->elemsize + (long)local_48->data);
      auVar50 = ZEXT1664((undefined1  [16])0x0);
      if (0 < iVar17) {
        auVar52 = ZEXT1664((undefined1  [16])0x0);
        auVar54 = ZEXT1664((undefined1  [16])0x0);
        auVar57 = ZEXT1664((undefined1  [16])0x0);
        iVar32 = iVar17;
        while( true ) {
          bVar42 = iVar32 == 0;
          iVar32 = iVar32 + -1;
          auVar51 = auVar50._0_16_;
          auVar53 = auVar52._0_16_;
          auVar43 = auVar54._0_16_;
          auVar56 = auVar57._0_16_;
          if (bVar42) break;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *puVar36;
          auVar4 = vpmovsxbw_avx(auVar3);
          auVar55 = *pauVar35;
          auVar3 = vpcmpgtb_avx((undefined1  [16])0x0,auVar55);
          auVar5 = vpunpcklbw_avx(auVar55,auVar3);
          auVar3 = vpunpckhbw_avx(auVar55,auVar3);
          auVar58._0_8_ = auVar4._0_8_;
          auVar58._8_8_ = auVar58._0_8_;
          auVar4 = vpmullw_avx(auVar5,auVar58);
          auVar55 = vpmulhw_avx(auVar5,auVar58);
          auVar5 = vpmullw_avx(auVar58,auVar3);
          auVar3 = vpmulhw_avx(auVar58,auVar3);
          auVar58 = vpunpcklwd_avx(auVar4,auVar55);
          auVar51 = vpaddd_avx(auVar51,auVar58);
          auVar50 = ZEXT1664(auVar51);
          auVar51 = vpunpckhwd_avx(auVar4,auVar55);
          auVar51 = vpaddd_avx(auVar53,auVar51);
          auVar52 = ZEXT1664(auVar51);
          auVar51 = vpunpcklwd_avx(auVar5,auVar3);
          auVar51 = vpaddd_avx(auVar43,auVar51);
          auVar54 = ZEXT1664(auVar51);
          auVar51 = vpunpckhwd_avx(auVar5,auVar3);
          auVar51 = vpaddd_avx(auVar56,auVar51);
          auVar57 = ZEXT1664(auVar51);
          puVar36 = (ulong *)((long)puVar36 + 4);
          pauVar35 = pauVar35 + 1;
        }
        auVar55 = vpunpckldq_avx(auVar51,auVar53);
        auVar3 = vpunpckldq_avx(auVar43,auVar56);
        auVar53 = vpunpckhdq_avx(auVar51,auVar53);
        auVar43 = vpunpckhdq_avx(auVar43,auVar56);
        auVar56 = vpunpcklqdq_avx(auVar55,auVar3);
        auVar51 = vpunpckhqdq_avx(auVar55,auVar3);
        auVar51 = vpaddd_avx(auVar56,auVar51);
        auVar56 = vpunpcklqdq_avx(auVar53,auVar43);
        auVar53 = vpunpckhqdq_avx(auVar53,auVar43);
        auVar53 = vpaddd_avx(auVar53,auVar56);
        auVar51 = vpaddd_avx(auVar51,auVar53);
        auVar50 = ZEXT1664(auVar51);
      }
      for (lVar40 = 0; iVar16 != (int)lVar40; lVar40 = lVar40 + 1) {
        auVar43 = vpbroadcastw_avx512vl();
        auVar51._8_8_ = 0;
        auVar51._0_8_ = *(ulong *)(*pauVar35 + lVar40 * 4);
        auVar51 = vpmovsxbw_avx(auVar51);
        auVar53 = vpmullw_avx(auVar43,auVar51);
        auVar51 = vpmulhw_avx(auVar43,auVar51);
        auVar51 = vpunpcklwd_avx(auVar53,auVar51);
        auVar51 = vpaddd_avx(auVar50._0_16_,auVar51);
        auVar50 = ZEXT1664(auVar51);
      }
      *pauVar30 = auVar50._0_16_;
      pauVar30 = pauVar30 + 1;
      uVar26 = (ulong)(uVar27 + 1);
    }
  }
  piVar14 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if ((Allocator *)local_a8._32_8_ == (Allocator *)0x0) {
        free((void *)local_a8._0_8_);
      }
      else {
        (*(*(_func_int ***)local_a8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack1to4_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_pack1to4_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_pack1to4_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_pack1to4_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_pack1to4_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
    if (inch >= 4)
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch / 4 + inch % 4, size / 4 + (size % 4) / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#endif
    }
    else
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#endif
    }
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            signed char* tmpptr = tmp.channel(i / 4);

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr[8] = img0[2];
                    tmpptr[9] = img1[2];
                    tmpptr[10] = img2[2];
                    tmpptr[11] = img3[2];
                    tmpptr[12] = img0[3];
                    tmpptr[13] = img1[3];
                    tmpptr[14] = img2[3];
                    tmpptr[15] = img3[3];
                    tmpptr += 16;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];
                    tmpptr[2] = img0[2];
                    tmpptr[3] = img0[3];

                    tmpptr += 4;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = (size - remain_size_start) >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            signed char* tmpptr = tmp.channel(i / 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr += 8;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];

                    tmpptr += 2;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr += 4;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];

                    tmpptr += 1;

                    img0 += size;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m256i _sum00_12 = _mm256_setzero_si256();
            __m256i _sum20_32 = _mm256_setzero_si256();

            if (nn4 > 0)
            {
#if __AVXVNNI__ || __AVX512VNNI__
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum30_22 = _mm256_setzero_si256();
#else
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum01_13 = _mm256_setzero_si256();
                __m256i _sum11_03 = _mm256_setzero_si256();
                __m256i _sum30_22 = _mm256_setzero_si256();
                __m256i _sum21_33 = _mm256_setzero_si256();
                __m256i _sum31_23 = _mm256_setzero_si256();
#endif

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val0123 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val0123_16 = _mm256_cvtepi8_epi16(_val0123);

                    __m256i _val01_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(1, 1, 0, 0));
                    __m256i _val23_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(3, 3, 2, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);
                    __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
                    _sum20_32 = _mm256_dpwssd_epi32(_sum20_32, _val23_16, _w01_16);
                    _sum30_22 = _mm256_dpwssd_epi32(_sum30_22, _val32_16, _w01_16);
#else
                    __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                    __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                    __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                    __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);
                    __m256i _sl20_31 = _mm256_mullo_epi16(_val23_16, _w01_16);
                    __m256i _sh20_31 = _mm256_mulhi_epi16(_val23_16, _w01_16);
                    __m256i _sl30_21 = _mm256_mullo_epi16(_val32_16, _w01_16);
                    __m256i _sh30_21 = _mm256_mulhi_epi16(_val32_16, _w01_16);

                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                    _sum01_13 = _mm256_add_epi32(_sum01_13, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                    _sum11_03 = _mm256_add_epi32(_sum11_03, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
                    _sum20_32 = _mm256_add_epi32(_sum20_32, _mm256_unpacklo_epi16(_sl20_31, _sh20_31));
                    _sum30_22 = _mm256_add_epi32(_sum30_22, _mm256_unpacklo_epi16(_sl30_21, _sh30_21));
                    _sum21_33 = _mm256_add_epi32(_sum21_33, _mm256_unpackhi_epi16(_sl20_31, _sh20_31));
                    _sum31_23 = _mm256_add_epi32(_sum31_23, _mm256_unpackhi_epi16(_sl30_21, _sh30_21));
#endif

                    tmpptr += 16;
                    kptr0 += 16;
                }

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);
                _sum20_32 = _mm256_hadd_epi32(_sum20_32, _sum30_22);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
                _sum20_32 = _mm256_permute4x64_epi64(_sum20_32, _MM_SHUFFLE(2, 1, 3, 0));
#else
                // transpose 4x8
                {
                    __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm256_unpacklo_epi32(_sum00_12, _sum10_02);
                    _tmp1 = _mm256_unpacklo_epi32(_sum01_13, _sum11_03);
                    _tmp2 = _mm256_unpackhi_epi32(_sum00_12, _sum10_02);
                    _tmp3 = _mm256_unpackhi_epi32(_sum01_13, _sum11_03);
                    _sum00_12 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                    _sum10_02 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                    _sum01_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                    _sum11_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
                }
                {
                    __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm256_unpacklo_epi32(_sum20_32, _sum30_22);
                    _tmp1 = _mm256_unpacklo_epi32(_sum21_33, _sum31_23);
                    _tmp2 = _mm256_unpackhi_epi32(_sum20_32, _sum30_22);
                    _tmp3 = _mm256_unpackhi_epi32(_sum21_33, _sum31_23);
                    _sum20_32 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                    _sum30_22 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                    _sum21_33 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                    _sum31_23 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum10_02);
                _sum01_13 = _mm256_add_epi32(_sum01_13, _sum11_03);
                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum01_13);

                _sum20_32 = _mm256_add_epi32(_sum20_32, _sum30_22);
                _sum21_33 = _mm256_add_epi32(_sum21_33, _sum31_23);
                _sum20_32 = _mm256_add_epi32(_sum20_32, _sum21_33);

                __m256i _perm_mask = _mm256_set_epi32(6, 4, 3, 1, 7, 5, 2, 0);
                _sum00_12 = _mm256_permutevar8x32_epi32(_sum00_12, _perm_mask);
                _sum20_32 = _mm256_permutevar8x32_epi32(_sum20_32, _perm_mask);
#endif
            }

            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
            __m128i _sum20 = _mm256_extracti128_si256(_sum20_32, 0);
            __m128i _sum30 = _mm256_extracti128_si256(_sum20_32, 1);

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val01 = _mm_set_epi16(tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[0], tmpptr[0], tmpptr[0], tmpptr[0]);
                __m128i _val23 = _mm_set_epi16(tmpptr[3], tmpptr[3], tmpptr[3], tmpptr[3], tmpptr[2], tmpptr[2], tmpptr[2], tmpptr[2]);

                __m128i _w0123 = _mm_set_epi16(kptr0[3], kptr0[2], kptr0[1], kptr0[0], kptr0[3], kptr0[2], kptr0[1], kptr0[0]);

                __m128i _sl00 = _mm_mullo_epi16(_val01, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val01, _w0123);
                __m128i _sl10 = _mm_mullo_epi16(_val23, _w0123);
                __m128i _sh10 = _mm_mulhi_epi16(_val23, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum20 = _mm_add_epi32(_sum20, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum30 = _mm_add_epi32(_sum30, _mm_unpackhi_epi16(_sl10, _sh10));

                tmpptr += 4;
                kptr0 += 4;
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
            _mm_storeu_si128((__m128i*)(outptr0 + 8), _sum20);
            _mm_storeu_si128((__m128i*)(outptr0 + 12), _sum30);
            outptr0 += 16;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

#if __AVX2__
            __m256i _sum00_12 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
#endif

            if (nn4 > 0)
            {
#if __AVX2__
#if __AVXVNNI__ || __AVX512VNNI__
                __m256i _sum10_02 = _mm256_setzero_si256();
#else
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum01_13 = _mm256_setzero_si256();
                __m256i _sum11_03 = _mm256_setzero_si256();
#endif
#else
#if __XOP__
                __m128i _sum01 = _mm_setzero_si128();
                __m128i _sum11 = _mm_setzero_si128();
#else
                __m128i _sum01 = _mm_setzero_si128();
                __m128i _sum02 = _mm_setzero_si128();
                __m128i _sum03 = _mm_setzero_si128();
                __m128i _sum11 = _mm_setzero_si128();
                __m128i _sum12 = _mm_setzero_si128();
                __m128i _sum13 = _mm_setzero_si128();
#endif
#endif

                int j = 0;
                for (; j < nn4; j++)
                {
#if __AVX2__
                    __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                    _val01_16 = _mm256_permute4x64_epi64(_val01_16, _MM_SHUFFLE(1, 1, 0, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
#else
                    __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                    __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                    __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                    __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);

                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                    _sum01_13 = _mm256_add_epi32(_sum01_13, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                    _sum11_03 = _mm256_add_epi32(_sum11_03, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
#endif
#else
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    _val01 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    _val01 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    __m128i _val0 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(1, 0, 1, 0));
                    __m128i _val1 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(3, 2, 3, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

#if __XOP__
                    _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                    _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                    _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                    _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
#else
                    __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                    __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                    __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                    __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);
                    __m128i _sl10 = _mm_mullo_epi16(_val1, _w0);
                    __m128i _sh10 = _mm_mulhi_epi16(_val1, _w0);
                    __m128i _sl11 = _mm_mullo_epi16(_val1, _w1);
                    __m128i _sh11 = _mm_mulhi_epi16(_val1, _w1);

                    _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                    _sum01 = _mm_add_epi32(_sum01, _mm_unpackhi_epi16(_sl00, _sh00));
                    _sum02 = _mm_add_epi32(_sum02, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum03 = _mm_add_epi32(_sum03, _mm_unpackhi_epi16(_sl01, _sh01));
                    _sum10 = _mm_add_epi32(_sum10, _mm_unpacklo_epi16(_sl10, _sh10));
                    _sum11 = _mm_add_epi32(_sum11, _mm_unpackhi_epi16(_sl10, _sh10));
                    _sum12 = _mm_add_epi32(_sum12, _mm_unpacklo_epi16(_sl11, _sh11));
                    _sum13 = _mm_add_epi32(_sum13, _mm_unpackhi_epi16(_sl11, _sh11));
#endif
#endif

                    tmpptr += 8;
                    kptr0 += 16;
                }

#if __AVX2__
#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
#else
                // transpose 4x8
                {
                    __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm256_unpacklo_epi32(_sum00_12, _sum10_02);
                    _tmp1 = _mm256_unpacklo_epi32(_sum01_13, _sum11_03);
                    _tmp2 = _mm256_unpackhi_epi32(_sum00_12, _sum10_02);
                    _tmp3 = _mm256_unpackhi_epi32(_sum01_13, _sum11_03);
                    _sum00_12 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                    _sum10_02 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                    _sum01_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                    _sum11_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum10_02);
                _sum01_13 = _mm256_add_epi32(_sum01_13, _sum11_03);
                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum01_13);

                __m256i _perm_mask = _mm256_set_epi32(6, 4, 3, 1, 7, 5, 2, 0);
                _sum00_12 = _mm256_permutevar8x32_epi32(_sum00_12, _perm_mask);
#endif
#else
#if __XOP__
                _sum00 = _mm_hadd_epi32(_sum00, _sum01);
                _sum10 = _mm_hadd_epi32(_sum10, _sum11);
#else
                // transpose 4x4
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                    _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                    _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                    _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                    _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                    _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                    _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                    _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                    _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum00 = _mm_add_epi32(_sum00, _sum01);
                _sum02 = _mm_add_epi32(_sum02, _sum03);
                _sum10 = _mm_add_epi32(_sum10, _sum11);
                _sum12 = _mm_add_epi32(_sum12, _sum13);

                _sum00 = _mm_add_epi32(_sum00, _sum02);
                _sum10 = _mm_add_epi32(_sum10, _sum12);
#endif
#endif
            }

#if __AVX2__
            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
#endif

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set_epi16(tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[0], tmpptr[0], tmpptr[0], tmpptr[0]);

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                _w0123 = _mm_shuffle_epi32(_w0123, _MM_SHUFFLE(1, 0, 1, 0));

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));

                tmpptr += 2;
                kptr0 += 4;
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m128i _sum0 = _mm_setzero_si128();

            if (nn4 > 0)
            {
                __m128i _sum1 = _mm_setzero_si128();
                __m128i _sum2 = _mm_setzero_si128();
                __m128i _sum3 = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    __m128i _val0 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    _val0 = _mm_shuffle_epi32(_val0, _MM_SHUFFLE(1, 0, 1, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

                    __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                    __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                    __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                    __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);

                    _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));
                    _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl00, _sh00));
                    _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl01, _sh01));

                    tmpptr += 4;
                    kptr0 += 16;
                }

                // transpose 4x4
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                    _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                    _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                    _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                    _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum0 = _mm_add_epi32(_sum0, _sum1);
                _sum2 = _mm_add_epi32(_sum2, _sum3);
                _sum0 = _mm_add_epi32(_sum0, _sum2);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set1_epi16(tmpptr[0]);

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));

                tmpptr += 1;
                kptr0 += 4;
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum0);
            outptr0 += 4;
        }
    }
}